

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

Span<char>
absl::lts_20250127::log_internal::EncodeMessageStart(uint64_t tag,uint64_t max_size,Span<char> *buf)

{
  anon_unknown_4 *this;
  bool bVar1;
  anon_unknown_4 *paVar2;
  Span<char> *buf_00;
  uint64_t value;
  pointer pcVar3;
  ulong value_00;
  ulong uVar4;
  Span<char> SVar5;
  
  this = (anon_unknown_4 *)(tag * 8 + 2);
  value_00 = 1;
  value = 1;
  paVar2 = this;
  if (0x7f < tag << 3) {
    do {
      value = value + 1;
      bVar1 = (anon_unknown_4 *)0x3fff < paVar2;
      paVar2 = (anon_unknown_4 *)((ulong)paVar2 >> 7);
    } while (bVar1);
  }
  buf_00 = (Span<char> *)buf->len_;
  if (buf_00 < max_size) {
    max_size = (uint64_t)buf_00;
  }
  if ((Span<char> *)0x7f < max_size) {
    value_00 = 1;
    do {
      value_00 = value_00 + 1;
      bVar1 = (Span<char> *)0x3fff < max_size;
      max_size = (uint64_t)(max_size >> 7);
    } while (bVar1);
  }
  if (buf_00 < (Span<char> *)(value_00 + value)) {
    buf->len_ = 0;
    uVar4 = 0;
    pcVar3 = (pointer)0x0;
  }
  else {
    anon_unknown_4::EncodeRawVarint(this,value,(size_t)buf,buf_00);
    pcVar3 = buf->ptr_;
    uVar4 = buf->len_;
    if (value_00 <= buf->len_) {
      uVar4 = value_00;
    }
    anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)0x0,value_00,(size_t)buf,buf_00);
  }
  SVar5.len_ = uVar4;
  SVar5.ptr_ = pcVar3;
  return SVar5;
}

Assistant:

ABSL_MUST_USE_RESULT absl::Span<char> EncodeMessageStart(
    uint64_t tag, uint64_t max_size, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  max_size = std::min<uint64_t>(max_size, buf->size());
  const size_t length_size = VarintSize(max_size);
  if (tag_type_size + length_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return absl::Span<char>();
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  const absl::Span<char> ret = buf->subspan(0, length_size);
  EncodeRawVarint(0, length_size, buf);
  return ret;
}